

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_extend(HSQUIRRELVM v)

{
  SQArray *this;
  SQObjectPtr *pSVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  char *err;
  long lVar4;
  
  pSVar1 = SQVM::GetAt(v,v->_stackbase);
  if (((pSVar1->super_SQObject)._flags & 1) != 0) {
    err = "Cannot modify immutable object";
LAB_0011d298:
    SVar3 = sq_throwerror(v,err);
    return SVar3;
  }
  pSVar1 = SQVM::GetAt(v,v->_stackbase);
  this = (pSVar1->super_SQObject)._unVal.pArray;
  SVar2 = sq_gettop(v);
  if (1 < SVar2) {
    lVar4 = 1;
    do {
      pSVar1 = SQVM::GetAt(v,v->_stackbase + lVar4);
      if ((pSVar1->super_SQObject)._type != OT_ARRAY) {
        err = "only arrays can be used to extend array";
        goto LAB_0011d298;
      }
      SQArray::Extend(this,(pSVar1->super_SQObject)._unVal.pArray);
      lVar4 = lVar4 + 1;
    } while (SVar2 != lVar4);
  }
  sq_pop(v,SVar2 + -1);
  return 1;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *arr = _array(stack_get(v, 1));
    SQInteger n = sq_gettop(v)-1;
    for (SQInteger i=0; i<n; ++i) {
        SQObject &o=stack_get(v,2+i);
        if (sq_type(o) != OT_ARRAY)
            return sq_throwerror(v, _SC("only arrays can be used to extend array"));
        arr->Extend(_array(o));
    }
    sq_pop(v,n);
    return 1;
}